

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef expr,BinaryenExpressionRef endExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef endExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::StringSliceWTF>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<StringSliceWTF>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x135c,
                  "void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (endExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = endExpr;
    return;
  }
  __assert_fail("endExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x135d,
                "void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef endExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringSliceWTF>());
  assert(endExpr);
  static_cast<StringSliceWTF*>(expression)->end = (Expression*)endExpr;
}